

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UCharsTrieBuilder::buildUnicodeString
          (UCharsTrieBuilder *this,UStringTrieBuildOption buildOption,UnicodeString *result,
          UErrorCode *errorCode)

{
  ConstChar16Ptr local_30 [3];
  
  buildUChars(this,buildOption,errorCode);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_30[0].p_ = this->uchars + ((long)this->ucharsCapacity - (long)this->ucharsLength);
    UnicodeString::setTo(result,'\0',local_30,this->ucharsLength);
  }
  return result;
}

Assistant:

UnicodeString &
UCharsTrieBuilder::buildUnicodeString(UStringTrieBuildOption buildOption, UnicodeString &result,
                                      UErrorCode &errorCode) {
    buildUChars(buildOption, errorCode);
    if(U_SUCCESS(errorCode)) {
        result.setTo(FALSE, uchars+(ucharsCapacity-ucharsLength), ucharsLength);
    }
    return result;
}